

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O3

from_chars_result_t<char>
fast_float::from_chars_advanced<double,char>
          (char *first,char *last,double *value,parse_options_t<char> options)

{
  char cVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  from_chars_result_t<char> fVar16;
  from_chars_result_t<char> fVar17;
  from_chars_result_t<char> fVar18;
  from_chars_result_t<char> fVar19;
  from_chars_result_t<char> fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  uint uVar24;
  int iVar25;
  byte bVar26;
  int iVar27;
  undefined4 uVar28;
  long lVar29;
  bigint *pbVar30;
  undefined4 uVar31;
  byte *pbVar32;
  long lVar33;
  ulong uVar34;
  byte *pbVar35;
  byte *pbVar36;
  size_t sVar37;
  ulong uVar38;
  ulong uVar39;
  int32_t exponent;
  ulong uVar40;
  ulong uVar41;
  bigint *bigmant;
  int iVar42;
  uint uVar43;
  byte *pbVar44;
  bool bVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  from_chars_result_t<char> fVar48;
  adjusted_mantissa aVar49;
  parsed_number_string_t<char> answer;
  size_t digits;
  byte *local_280;
  parsed_number_string_t<char> local_278;
  size_t local_230;
  bigint local_228;
  
  if (first == last) {
    fVar48._8_8_ = 0x16;
    fVar48.ptr = first;
    return fVar48;
  }
  local_278.fraction.ptr = (char *)0x0;
  local_278.fraction.length = 0;
  local_278.integer.ptr = (char *)0x0;
  local_278.integer.length = 0;
  local_278.exponent = 0;
  local_278.mantissa._0_3_ = 0;
  local_278.mantissa._3_5_ = 0;
  local_278.lastmatch._0_3_ = 0;
  local_278.lastmatch._3_5_ = 0;
  local_278.valid = false;
  local_278.too_many_digits = false;
  cVar1 = *first;
  local_278.negative = cVar1 == '-';
  uVar38 = (ulong)local_278.negative;
  bVar26 = options.decimal_point;
  pbVar32 = (byte *)first;
  if ((local_278.negative) &&
     ((pbVar32 = (byte *)(first + 1), pbVar32 == (byte *)last ||
      (*pbVar32 != bVar26 && 9 < (byte)(*pbVar32 - 0x30))))) goto LAB_003be832;
  uVar34 = ~(ulong)pbVar32;
  local_278.integer.length = 0;
  uVar39 = 0;
  do {
    bVar2 = pbVar32[local_278.integer.length];
    if (9 < (byte)(bVar2 - 0x30)) {
      local_280 = pbVar32 + local_278.integer.length;
      if (bVar2 != bVar26) {
        pbVar44 = (byte *)0x0;
        sVar37 = local_278.integer.length;
        pbVar36 = local_280;
        goto LAB_003be775;
      }
      local_278.fraction.ptr = (char *)(pbVar32 + local_278.integer.length + 1);
      local_278.fraction.length = (size_t)local_278.fraction.ptr;
      pbVar44 = (byte *)local_278.fraction.ptr;
      if ((long)(last + (uVar34 - local_278.integer.length)) < 8) goto LAB_003be719;
      lVar33 = uVar34 - local_278.integer.length;
      goto LAB_003be676;
    }
    uVar39 = ((ulong)bVar2 + uVar39 * 10) - 0x30;
    lVar33 = local_278.integer.length + 1;
    local_278.integer.length = local_278.integer.length + 1;
  } while (pbVar32 + lVar33 != (byte *)last);
  pbVar44 = (byte *)0x0;
  sVar37 = (long)last - (long)pbVar32;
  pbVar36 = (byte *)last;
  local_280 = (byte *)last;
  local_278.integer.length = (long)last - (long)pbVar32;
  goto LAB_003be775;
LAB_003be9d4:
  pbVar44 = local_280 + (lVar33 - (long)pbVar32);
  local_278.mantissa._0_3_ = (undefined3)uVar39;
  local_278.mantissa._3_5_ = (undefined5)(uVar39 >> 0x18);
  bVar46 = true;
  goto LAB_003be9e7;
  while( true ) {
    uVar38 = (uVar38 >> 8) + uVar38 * 10;
    uVar39 = ((uVar38 >> 0x10 & 0xff000000ff) * 0x271000000001 +
              (uVar38 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar39 * 100000000;
    pbVar44 = pbVar44 + 8;
    lVar29 = lVar33 + -8;
    lVar33 = lVar33 + -8;
    if ((long)(last + lVar29) < 8) break;
LAB_003be676:
    uVar38 = *(long *)pbVar44 + 0xcfcfcfcfcfcfcfd0;
    if (((*(long *)pbVar44 + 0x4646464646464646U | uVar38) & 0x8080808080808080) != 0) break;
  }
  uVar38 = CONCAT71(0x80808080808080,local_278.negative);
  local_278.fraction.length = (size_t)-lVar33;
LAB_003be719:
  pbVar36 = pbVar44;
  if (pbVar44 != (byte *)last) {
    pbVar35 = pbVar44 + ((long)last - local_278.fraction.length);
    do {
      bVar2 = *pbVar44;
      local_278.fraction.length = (size_t)pbVar44;
      pbVar36 = pbVar44;
      if (9 < (byte)(bVar2 - 0x30)) break;
      pbVar44 = pbVar44 + 1;
      uVar39 = (ulong)(byte)(bVar2 - 0x30) + uVar39 * 10;
      local_278.fraction.length = (size_t)pbVar35;
      pbVar36 = pbVar35;
    } while (pbVar44 != (byte *)last);
  }
  pbVar44 = pbVar32 + (local_278.integer.length - local_278.fraction.length) + 1;
  local_278.fraction.length = local_278.fraction.length + (uVar34 - local_278.integer.length);
  sVar37 = local_278.integer.length - (long)pbVar44;
LAB_003be775:
  local_278.integer.ptr = (char *)pbVar32;
  if (sVar37 == 0) goto LAB_003be832;
  if (((ulong)options & 1) == 0) {
LAB_003be848:
    lVar33 = 0;
  }
  else {
    if ((pbVar36 == (byte *)last) || ((*pbVar36 | 0x20) != 0x65)) {
LAB_003be82c:
      if (((ulong)options & 4) == 0) {
LAB_003be832:
        fVar48 = detail::parse_infnan<double,char>(first,last,value);
        return fVar48;
      }
      goto LAB_003be848;
    }
    pbVar35 = pbVar36 + 1;
    if (pbVar35 == (byte *)last) {
LAB_003be7d3:
      bVar46 = false;
    }
    else {
      if (*pbVar35 != 0x2d) {
        if (*pbVar35 == 0x2b) {
          pbVar35 = pbVar36 + 2;
        }
        goto LAB_003be7d3;
      }
      pbVar35 = pbVar36 + 2;
      bVar46 = true;
    }
    if ((pbVar35 == (byte *)last) || (9 < (byte)(*pbVar35 - 0x30))) goto LAB_003be82c;
    lVar29 = 0;
    do {
      pbVar36 = pbVar35;
      if (9 < (byte)(*pbVar35 - 0x30)) break;
      if (lVar29 < 0x10000000) {
        lVar29 = (ulong)(byte)(*pbVar35 - 0x30) + lVar29 * 10;
      }
      pbVar35 = pbVar35 + 1;
      pbVar36 = (byte *)last;
    } while (pbVar35 != (byte *)last);
    lVar33 = -lVar29;
    if (!bVar46) {
      lVar33 = lVar29;
    }
    pbVar44 = pbVar44 + lVar33;
  }
  local_278.lastmatch._0_3_ = SUB83(pbVar36,0);
  local_278.lastmatch._3_5_ = (undefined5)((ulong)pbVar36 >> 0x18);
  local_278.valid = true;
  pbVar35 = pbVar32;
  if (0x13 < (long)sVar37) {
    do {
      bVar2 = *pbVar35;
      if (bVar2 != bVar26 && bVar2 != 0x30) break;
      sVar37 = sVar37 - (bVar2 == 0x30);
      pbVar35 = pbVar35 + 1;
    } while (pbVar35 != (byte *)last);
    uVar38 = uVar38 & 0xffffffff;
    if (0x13 < (long)sVar37) {
      local_278.too_many_digits = true;
      pbVar35 = (byte *)local_278.fraction.ptr;
      pbVar44 = (byte *)local_278.fraction.length;
      if (local_278.integer.length == 0) {
        uVar39 = 0;
        goto joined_r0x003be99a;
      }
      uVar39 = 0;
      sVar37 = local_278.integer.length;
      do {
        sVar37 = sVar37 - 1;
        uVar39 = ((long)(char)*pbVar32 + uVar39 * 10) - 0x30;
        pbVar32 = pbVar32 + 1;
        if (999999999999999999 < uVar39) break;
      } while (sVar37 != 0);
      do {
        if (999999999999999999 < uVar39) goto LAB_003be9d4;
joined_r0x003be99a:
        pbVar32 = pbVar35;
        local_280 = (byte *)local_278.fraction.ptr;
        if (pbVar44 == (byte *)0x0) goto LAB_003be9d4;
        uVar39 = ((long)(char)*pbVar32 + uVar39 * 10) - 0x30;
        pbVar32 = pbVar32 + 1;
        pbVar35 = pbVar32;
        pbVar44 = pbVar44 + -1;
      } while( true );
    }
  }
  local_278.mantissa._0_3_ = (undefined3)uVar39;
  local_278.mantissa._3_5_ = (undefined5)(uVar39 >> 0x18);
  if ((byte *)0xffffffffffffffd2 < pbVar44 + -0x17) {
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < (long)pbVar44) &&
         (uVar39 <= (ulong)(&binary_format_lookup_tables<double,void>::max_mantissa)[(long)pbVar44])
         ) {
        if (uVar39 == 0) {
          if (cVar1 == '-') {
            uVar43 = 0x80000000;
          }
          else {
            uVar43 = 0;
          }
          *value = (double)((ulong)uVar43 << 0x20);
          fVar20._8_8_ = 0;
          fVar20.ptr = (char *)pbVar36;
          return fVar20;
        }
        auVar47._8_4_ = (int)(uVar39 >> 0x20);
        auVar47._0_8_ = uVar39;
        auVar47._12_4_ = 0x45300000;
        dVar15 = ((auVar47._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar39) - 4503599627370496.0)) *
                 (double)(&binary_format_lookup_tables<double,void>::powers_of_ten)[(long)pbVar44];
        goto LAB_003beb51;
      }
    }
    else if (uVar39 < 0x20000000000001) {
      dVar15 = (double)(long)uVar39;
      *value = dVar15;
      if ((long)pbVar44 < 0) {
        dVar15 = dVar15 / (double)(&binary_format_lookup_tables<double,void>::powers_of_ten)
                                  [-(long)pbVar44];
      }
      else {
        dVar15 = dVar15 * (double)(&binary_format_lookup_tables<double,void>::powers_of_ten)
                                  [(long)pbVar44];
      }
LAB_003beb51:
      fVar19._8_8_ = 0;
      fVar19.ptr = (char *)pbVar36;
      fVar18._8_8_ = 0;
      fVar18.ptr = (char *)pbVar36;
      *value = dVar15;
      if (cVar1 != '-') {
        return fVar18;
      }
      *value = -dVar15;
      return fVar19;
    }
  }
  bVar46 = false;
LAB_003be9e7:
  uVar34 = 0;
  iVar42 = (int)pbVar44;
  if ((long)pbVar44 < -0x156) {
LAB_003bea0f:
    bigmant = (bigint *)0x0;
  }
  else {
    bigmant = (bigint *)0x0;
    if (uVar39 != 0) {
      if (0x134 < (long)pbVar44) {
        uVar34 = 0x7ff;
        goto LAB_003bea0f;
      }
      uVar34 = 0x3f;
      if (uVar39 != 0) {
        for (; uVar39 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar41 = uVar39 << ((byte)(uVar34 ^ 0x3f) & 0x3f);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar41;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar42 * 2 + 0x2ac) * 8);
      auVar3 = auVar3 * auVar9;
      if ((~auVar3._8_4_ & 0x1ff) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar41;
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ad) * 8);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = SUB168(auVar4 * auVar10,8);
        auVar3 = auVar3 + auVar21;
      }
      iVar25 = (((iVar42 * 0x3526a >> 0x10) - (int)(uVar34 ^ 0x3f)) - (auVar3._12_4_ >> 0x1f)) +
               0x43e;
      bVar26 = 9 - (auVar3[0xf] >> 7);
      uVar34 = auVar3._8_8_ >> (bVar26 & 0x3f);
      if (iVar25 < 1) {
        uVar43 = 1 - iVar25;
        if (uVar43 < 0x40) {
          uVar41 = (uVar34 >> ((byte)uVar43 & 0x3f)) +
                   (ulong)((uVar34 >> ((ulong)uVar43 & 0x3f) & 1) != 0);
          uVar34 = (ulong)(uVar41 >> 0x35 != 0);
          bigmant = (bigint *)(uVar41 >> 1);
        }
        else {
          uVar34 = 0;
          bigmant = (bigint *)0x0;
        }
      }
      else {
        uVar41 = uVar34 & 0xfffffffffffffe;
        if (uVar34 << (bVar26 & 0x3f) != auVar3._8_8_ || ((uint)uVar34 & 3) != 1) {
          uVar41 = uVar34;
        }
        if (1 < auVar3._0_8_) {
          uVar41 = uVar34;
        }
        if ((byte *)0x1b < pbVar44 + 4) {
          uVar41 = uVar34;
        }
        uVar34 = (ulong)((uint)uVar41 & 1);
        bVar45 = uVar34 + uVar41 >> 0x36 != 0;
        bigmant = (bigint *)((uVar41 >> 1) + (uVar34 & uVar41) & 0x7fefffffffffffff);
        if (bVar45) {
          bigmant = (bigint *)0x0;
        }
        uVar24 = iVar25 + (uint)bVar45;
        uVar43 = uVar24;
        if (0x7fe < uVar24) {
          uVar43 = 0x7ff;
        }
        uVar34 = (ulong)uVar43;
        if (0x7fe < uVar24) {
          bigmant = (bigint *)0x0;
        }
      }
      uVar38 = uVar38 & 0xffffffff;
    }
  }
  if (!bVar46) goto LAB_003bef18;
  uVar41 = uVar39 + 1;
  uVar24 = 0;
  uVar43 = 0;
  if ((long)pbVar44 < -0x156) {
LAB_003bec0a:
    uVar24 = uVar43;
    pbVar30 = (bigint *)0x0;
  }
  else {
    pbVar30 = (bigint *)0x0;
    if (uVar41 != 0) {
      if (0x134 < (long)pbVar44) {
        uVar43 = 0x7ff;
        goto LAB_003bec0a;
      }
      uVar40 = 0x3f;
      if (uVar41 != 0) {
        for (; uVar41 >> uVar40 == 0; uVar40 = uVar40 - 1) {
        }
      }
      uVar41 = uVar41 << ((byte)(uVar40 ^ 0x3f) & 0x3f);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar41;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ac) * 8);
      auVar5 = auVar5 * auVar11;
      if ((~auVar5._8_4_ & 0x1ff) == 0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar41;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ad) * 8);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = SUB168(auVar6 * auVar12,8);
        auVar5 = auVar5 + auVar22;
      }
      iVar25 = (((iVar42 * 0x3526a >> 0x10) - (int)(uVar40 ^ 0x3f)) - (auVar5._12_4_ >> 0x1f)) +
               0x43e;
      bVar26 = 9 - (auVar5[0xf] >> 7);
      uVar41 = auVar5._8_8_ >> (bVar26 & 0x3f);
      if (iVar25 < 1) {
        uVar43 = 1 - iVar25;
        if (uVar43 < 0x40) {
          uVar41 = (uVar41 >> ((byte)uVar43 & 0x3f)) +
                   (ulong)((uVar41 >> ((ulong)uVar43 & 0x3f) & 1) != 0);
          pbVar30 = (bigint *)(uVar41 >> 1);
          uVar24 = (uint)(uVar41 >> 0x35 != 0);
        }
        else {
          pbVar30 = (bigint *)0x0;
          uVar24 = 0;
        }
      }
      else {
        uVar40 = uVar41 & 0xfffffffffffffe;
        if (uVar41 << (bVar26 & 0x3f) != auVar5._8_8_ || ((uint)uVar41 & 3) != 1) {
          uVar40 = uVar41;
        }
        if (1 < auVar5._0_8_) {
          uVar40 = uVar41;
        }
        if ((byte *)0x1b < pbVar44 + 4) {
          uVar40 = uVar41;
        }
        uVar41 = (ulong)((uint)uVar40 & 1);
        bVar46 = uVar41 + uVar40 >> 0x36 != 0;
        pbVar30 = (bigint *)((uVar40 >> 1) + (uVar41 & uVar40) & 0x7fefffffffffffff);
        if (bVar46) {
          pbVar30 = (bigint *)0x0;
        }
        uVar24 = iVar25 + (uint)bVar46;
        if (0x7fe < uVar24) {
          pbVar30 = (bigint *)0x0;
          uVar24 = 0x7ff;
        }
      }
      uVar38 = uVar38 & 0xffffffff;
    }
  }
  if ((bigmant != pbVar30) || ((uint)uVar34 != uVar24)) {
    local_278.exponent = (int64_t)pbVar44;
    if (uVar39 == 0) {
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    uVar38 = uVar38 & 0xffffffff;
    uVar34 = 0x3f;
    if (uVar39 != 0) {
      for (; uVar39 >> uVar34 == 0; uVar34 = uVar34 - 1) {
      }
    }
    uVar41 = uVar39 << ((byte)(uVar34 ^ 0x3f) & 0x3f);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar41;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ac) * 8);
    auVar7 = auVar7 * auVar13;
    lVar33 = auVar7._8_8_;
    if ((~auVar7._8_4_ & 0x1ff) == 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar41;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ad) * 8);
      lVar33 = lVar33 + (ulong)CARRY8(SUB168(auVar8 * auVar14,8),auVar7._0_8_);
    }
    bigmant = (bigint *)(lVar33 << ((byte)((ulong)lVar33 >> 0x3f) ^ 1));
    iVar27 = iVar42 * 0x3526a >> 0x10;
    iVar25 = -(int)(uVar34 ^ 0x3f) - (int)(lVar33 >> 0x3f);
    iVar42 = iVar25 + iVar27;
    if (iVar42 < 0x7bcd) {
      uVar38 = uVar39;
      if (9999 < uVar39) {
        do {
          uVar39 = uVar38 / 10000;
          pbVar44 = (byte *)(ulong)((int)pbVar44 + 4);
          bVar46 = 99999999 < uVar38;
          uVar38 = uVar39;
        } while (bVar46);
      }
      uVar38 = uVar39;
      if (99 < uVar39) {
        do {
          uVar38 = uVar39 / 100;
          pbVar44 = (byte *)(ulong)((int)pbVar44 + 2);
          bVar46 = 9999 < uVar39;
          uVar39 = uVar38;
        } while (bVar46);
      }
      uVar43 = (uint)pbVar44;
      if (9 < uVar38) {
        do {
          uVar43 = (int)pbVar44 + 1;
          pbVar44 = (byte *)(ulong)uVar43;
          bVar46 = 99 < uVar38;
          uVar38 = uVar38 / 10;
        } while (bVar46);
      }
      local_230 = 0;
      memset(&local_228,0,0x1f8);
      exponent = (int32_t)uVar41;
      parse_mantissa<char>(&local_228,&local_278,0x301,&local_230);
      iVar25 = (uVar43 - (int)local_230) + 1;
      if (iVar25 < 0) {
        aVar49.mantissa = (ulong)(iVar42 + 0x433);
        aVar49.power2 = iVar25;
        aVar49._12_4_ = 0;
        aVar49 = negative_digit_comp<double>((fast_float *)&local_228,bigmant,aVar49,exponent);
        auVar23 = aVar49._0_12_;
      }
      else {
        aVar49 = positive_digit_comp<double>(&local_228,iVar25);
        auVar23 = aVar49._0_12_;
      }
      bigmant = auVar23._0_8_;
      uVar34 = (ulong)auVar23._8_4_;
      uVar38 = (ulong)local_278.negative;
      uVar39 = CONCAT53(local_278.mantissa._3_5_,(undefined3)local_278.mantissa);
    }
    else {
      uVar34 = (ulong)((iVar25 + iVar27) - 0x7bcd);
      uVar39 = 1;
    }
  }
LAB_003bef18:
  uVar28 = 0;
  if ((int)uVar34 == 0x7ff) {
    uVar28 = 0x22;
  }
  uVar31 = 0x22;
  if ((int)uVar34 != 0) {
    uVar31 = uVar28;
  }
  if (bigmant != (bigint *)0x0) {
    uVar31 = uVar28;
  }
  fVar16.ec = uVar31;
  fVar16.ptr = (char *)pbVar36;
  fVar16._12_4_ = 0;
  *value = (double)(uVar38 << 0x3f | uVar34 << 0x34 | (ulong)bigmant);
  if (uVar39 != 0) {
    return fVar16;
  }
  fVar17.ec = uVar28;
  fVar17.ptr = (char *)pbVar36;
  fVar17._12_4_ = 0;
  return fVar17;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}